

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

int ImParseFormatPrecision(char *fmt,int default_precision)

{
  bool bVar1;
  char *pcVar2;
  int local_28;
  int local_20;
  int local_1c;
  int precision;
  int default_precision_local;
  char *fmt_local;
  
  local_1c = default_precision;
  _precision = fmt;
  _precision = ImParseFormatFindStart(fmt);
  if (*_precision == '%') {
    do {
      pcVar2 = _precision;
      _precision = pcVar2 + 1;
      bVar1 = false;
      if ('/' < *_precision) {
        bVar1 = *_precision < ':';
      }
    } while (bVar1);
    local_20 = 0x7fffffff;
    if ((*_precision == '.') &&
       ((_precision = ImAtoi<int>(pcVar2 + 2,&local_20), local_20 < 0 || (99 < local_20)))) {
      local_20 = local_1c;
    }
    if ((*_precision == 'e') || (*_precision == 'E')) {
      local_20 = -1;
    }
    if (((*_precision == 'g') || (*_precision == 'G')) && (local_20 == 0x7fffffff)) {
      local_20 = -1;
    }
    if (local_20 == 0x7fffffff) {
      local_28 = local_1c;
    }
    else {
      local_28 = local_20;
    }
    fmt_local._4_4_ = local_28;
  }
  else {
    fmt_local._4_4_ = local_1c;
  }
  return fmt_local._4_4_;
}

Assistant:

int ImParseFormatPrecision(const char* fmt, int default_precision)
{
    fmt = ImParseFormatFindStart(fmt);
    if (fmt[0] != '%')
        return default_precision;
    fmt++;
    while (*fmt >= '0' && *fmt <= '9')
        fmt++;
    int precision = INT_MAX;
    if (*fmt == '.')
    {
        fmt = ImAtoi<int>(fmt + 1, &precision);
        if (precision < 0 || precision > 99)
            precision = default_precision;
    }
    if (*fmt == 'e' || *fmt == 'E') // Maximum precision with scientific notation
        precision = -1;
    if ((*fmt == 'g' || *fmt == 'G') && precision == INT_MAX)
        precision = -1;
    return (precision == INT_MAX) ? default_precision : precision;
}